

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::splittetrahedron
          (tetgenmesh *this,triface *splittet,int qflag,double *ccent,int chkencflag)

{
  tetrahedron ppdVar1;
  memorypool *pmVar2;
  double *pdVar3;
  bool bVar4;
  locateresult lVar5;
  int iVar6;
  int iVar7;
  arraypool *paVar8;
  long lVar9;
  shellface pc;
  uint chkencflag_00;
  char *this_00;
  point pdVar10;
  long lVar11;
  double dVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  face searchsh;
  point newpt;
  triface searchtet;
  insertvertexflags ivf;
  double r;
  double fcent [3];
  double prjpt [3];
  face local_178;
  uint local_164;
  double *local_160;
  triface local_158;
  insertvertexflags local_148;
  double local_d0;
  double local_c8 [4];
  flipconstraints local_a8;
  
  lVar11 = 0;
  local_158.tet = (tetrahedron *)0x0;
  local_158.ver = 0;
  local_148.refinetet.tet = (tetrahedron *)0x0;
  local_148.refinetet.ver = 0;
  local_148.refinesh.sh = (shellface *)0x0;
  local_148.refinesh.shver = 0;
  local_148.smlenflag = 0;
  local_148.smlen = 0.0;
  local_148.iloc = 0;
  local_148.bowywat = 0;
  local_148.lawson = 0;
  local_148.splitbdflag = 0;
  local_148.validflag = 0;
  local_148.respectbdflag = 0;
  local_148.rejflag = 0;
  local_148.chkencflag = 0;
  local_148.cdtflag = 0;
  local_148.assignmeshsize = 0;
  local_148.sloc = 0;
  local_148.sbowywat = 0;
  local_148.refineflag = 0;
  makepoint(this,&local_160,FREEVOLVERTEX);
  pdVar3 = local_160;
  do {
    local_160[lVar11] = ccent[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (this->useinsertradius != 0) {
    ppdVar1 = splittet->tet[orgpivot[splittet->ver]];
    dVar12 = ((double)ppdVar1[2] - local_160[2]) * ((double)ppdVar1[2] - local_160[2]) +
             ((double)*ppdVar1 - *local_160) * ((double)*ppdVar1 - *local_160) +
             ((double)ppdVar1[1] - local_160[1]) * ((double)ppdVar1[1] - local_160[1]);
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    pdVar3[this->pointinsradiusindex] = dVar12;
  }
  local_158.tet = splittet->tet;
  local_158.ver = splittet->ver;
  local_148.iloc = 1;
  this_00 = (char *)this;
  local_148.iloc = locate(this,local_160,&local_158,1);
  if ((local_148.iloc == ENCSUBFACE) || (local_148.iloc == OUTSIDE)) {
    if (2 < this->b->verbose) {
      this_00 = "    New point %d is blocked by a polygon.\n";
      printf("    New point %d is blocked by a polygon.\n",
             (ulong)*(uint *)((long)local_160 + (long)this->pointmarkindex * 4));
    }
    *(uint *)((long)local_160 + (long)this->pointmarkindex * 4 + 4) =
         *(byte *)((long)local_160 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
    pmVar2 = this->points;
    *local_160 = (double)pmVar2->deaditemstack;
    pmVar2->deaditemstack = local_160;
    pmVar2->items = pmVar2->items + -1;
    if (this->b->nobisect != 0) {
      return 0;
    }
    local_178.shver = 0;
    if (local_158.tet[9] == (tetrahedron)0x0) {
      local_178.sh = (shellface *)0x0;
    }
    else {
      pdVar3 = local_158.tet[9][local_158.ver & 3];
      local_178.sh = (shellface *)((ulong)pdVar3 & 0xfffffffffffffff8);
      local_178.shver = tspivottbl[local_158.ver][(uint)pdVar3 & 7];
    }
    local_164 = chkencflag;
    projpt2face((tetgenmesh *)this_00,ccent,(double *)local_178.sh[3],(double *)local_178.sh[4],
                (double *)local_178.sh[5],(double *)&local_a8);
    iVar6 = 0;
    lVar5 = slocate(this,(point)&local_a8,&local_178,0,0,1);
    if (lVar5 - ONFACE < 2) {
      local_d0 = 0.0;
      pc = local_178.sh[5];
      iVar6 = checkfac4encroach(this,(point)local_178.sh[3],(point)local_178.sh[4],(point)pc,ccent,
                                local_c8,&local_d0);
      if (iVar6 == 0) {
        iVar6 = 0;
      }
      else {
        chkencflag_00 = local_164 | 2;
        iVar6 = 0;
        iVar7 = splitsubface(this,&local_178,(point)0x0,(point)pc,qflag,local_c8,local_164 | 2);
        if (iVar7 != 0) {
          repairencfacs(this,chkencflag_00);
          iVar6 = 1;
        }
      }
    }
    if (iVar6 == 0) {
      return 0;
    }
  }
  else {
    local_148.bowywat = 3;
    local_148.lawson = 2;
    iVar6 = this->b->metric;
    local_148.chkencflag = chkencflag;
    local_148.rejflag = (uint)(iVar6 != 0) * 4 + 3;
    local_148.sloc = 0;
    local_148.sbowywat = 0;
    local_148.splitbdflag = 0;
    local_148.validflag = 1;
    local_148.respectbdflag = 1;
    local_148.assignmeshsize = iVar6;
    local_148.refineflag = 1;
    local_148.refinetet.tet = splittet->tet;
    local_148.refinetet.ver = splittet->ver;
    iVar6 = 0;
    pdVar10 = (point)0x0;
    iVar7 = insertpoint(this,local_160,&local_158,(face *)0x0,(face *)0x0,&local_148);
    if (iVar7 != 0) {
      this->st_volref_count = this->st_volref_count + 1;
      if (0 < this->steinerleft) {
        this->steinerleft = this->steinerleft + -1;
      }
      if (this->flipstack == (badface *)0x0) {
        return 1;
      }
      local_a8.seg[0] = (point)0x0;
      local_a8.fac[0] = (point)0x0;
      local_a8.remvert = (point)0x0;
      local_a8.unflip = 0;
      local_a8.collectnewtets = 0;
      local_a8.collectencsegflag = 0;
      local_a8.remove_ndelaunay_edge = 0;
      local_a8.bak_tetprism_vol._0_4_ = 0;
      local_a8.bak_tetprism_vol._4_4_ = 0;
      local_a8.tetprism_vol_sum._0_4_ = 0;
      local_a8._36_8_ = 0;
      local_a8.cosdihed_in = 0.0;
      local_a8.cosdihed_out = 0.0;
      local_a8.checkflipeligibility = 0;
      local_a8.chkencflag = chkencflag;
      local_a8.enqflag = 2;
      lawsonflip3d(this,&local_a8);
      this->unflipqueue->objects = 0;
      return 1;
    }
    *(uint *)((long)local_160 + (long)this->pointmarkindex * 4 + 4) =
         *(byte *)((long)local_160 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
    pmVar2 = this->points;
    *local_160 = (double)pmVar2->deaditemstack;
    pmVar2->deaditemstack = local_160;
    pmVar2->items = pmVar2->items + -1;
    bVar4 = true;
    if (local_148.iloc == ENCSEGMENT) {
      if (((this->b->nobisect == 0) || (this->checkconstraints != 0)) &&
         (paVar8 = this->encseglist, 0 < paVar8->objects)) {
        lVar11 = 0;
        dVar12 = extraout_XMM0_Qa;
        do {
          iVar7 = splitsegment(this,(face *)(paVar8->toparray
                                             [(uint)lVar11 >>
                                              ((byte)paVar8->log2objectsperblock & 0x1f)] +
                                            (long)paVar8->objectbytes *
                                            (long)(int)(paVar8->objectsperblockmark & (uint)lVar11))
                               ,(point)0x0,dVar12,(point)paVar8->toparray,pdVar10,qflag,
                               chkencflag | 3);
          if (iVar7 != 0) {
            this->encseglist->objects = 0;
            if (0 < this->badsubsegs->items) {
              repairencsegs(this,chkencflag | 3);
            }
            lVar11 = this->badsubfacs->items;
            goto joined_r0x00146bf5;
          }
          lVar11 = lVar11 + 1;
          paVar8 = this->encseglist;
          dVar12 = extraout_XMM0_Qa_00;
        } while (lVar11 < paVar8->objects);
      }
      this->encseglist->objects = 0;
      bVar4 = true;
    }
    else if (local_148.iloc == ENCSUBFACE) {
      if (((this->b->nobisect == 0) || (this->checkconstraints != 0)) &&
         (paVar8 = this->encshlist, 0 < paVar8->objects)) {
        lVar11 = 0;
LAB_00146aab:
        pdVar10 = (point)paVar8->toparray
                         [(uint)lVar11 >> ((byte)paVar8->log2objectsperblock & 0x1f)];
        lVar9 = (long)paVar8->objectbytes * (long)(int)(paVar8->objectsperblockmark & (uint)lVar11);
        iVar7 = splitsubface(this,(face *)((long)pdVar10 + lVar9 + 0x10),(point)0x0,pdVar10,qflag,
                             (double *)((long)pdVar10 + lVar9 + 0x28),chkencflag | 2);
        if (iVar7 == 0) goto code_r0x00146af5;
        this->encshlist->objects = 0;
        lVar11 = this->badsubfacs->items;
joined_r0x00146bf5:
        if (0 < lVar11) {
          repairencfacs(this,chkencflag | 2);
        }
        iVar6 = 1;
        bVar4 = false;
        goto LAB_00146c07;
      }
LAB_00146b05:
      this->encshlist->objects = 0;
    }
    else {
      iVar6 = 0;
      if (local_148.iloc == NEARVERTEX) {
        puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
        puts("  the message above, your input data set, and the exact");
        puts("  command line you used to run this program, thank you.");
        exit(2);
      }
    }
LAB_00146c07:
    if (bVar4) {
      return iVar6;
    }
  }
  if ((splittet->tet != (tetrahedron *)0x0) && (splittet->tet[4] != (tetrahedron)0x0)) {
    enqueuetetrahedron(this,splittet);
  }
  return iVar6;
code_r0x00146af5:
  lVar11 = lVar11 + 1;
  paVar8 = this->encshlist;
  if (paVar8->objects <= lVar11) goto LAB_00146b05;
  goto LAB_00146aab;
}

Assistant:

int tetgenmesh::splittetrahedron(triface* splittet, int qflag, REAL *ccent, 
                                 int chkencflag)
{
  triface searchtet;
  face *paryseg;
  point newpt, *ppt;
  badface *bface;
  insertvertexflags ivf;
  int splitflag = 0;
  int i;



  REAL rv = 0.; // Insertion radius of 'newpt'.

  makepoint(&newpt, FREEVOLVERTEX);
  for (i = 0; i < 3; i++) newpt[i] = ccent[i];

  if (useinsertradius) {
    rv = distance(newpt, org(*splittet));
    setpointinsradius(newpt, rv);
  }

  // Locate the new point. Starting from an interior point 'q' of the
  //   splittet. We perform a walk from q to the 'newpt', stop walking
  //   either we hit a subface or enter OUTSIDE.
  searchtet = *splittet;
  ivf.iloc = (int) OUTSIDE;
  ivf.iloc = locate(newpt, &searchtet, 1); // 'chkencflag' = 1.

  if ((ivf.iloc == (int) OUTSIDE) || (ivf.iloc == (int) ENCSUBFACE)) {
    // The circumcenter 'c' is not visible from 'q' (the interior of the tet).
// iffalse
    if (b->verbose > 2) {
      printf("    New point %d is blocked by a polygon.\n", pointmark(newpt));
    }
// \fi
    pointdealloc(newpt);  // Do not insert this vertex.
    if (b->nobisect) return 0; // -Y option.
    // There must be a polygon that blocks the visibility.
    // Search a subpolygon that contains the proj(c).
    face searchsh;
    REAL prjpt[3];
    locateresult sloc = OUTSIDE;
    tspivot(searchtet, searchsh);
    ppt = (point *) &(searchsh.sh[3]);
    projpt2face(ccent, ppt[0], ppt[1], ppt[2], prjpt);
    // Locate proj(c) on polygon. 
    sloc = slocate(prjpt, &searchsh, 0, 0, 1);
    if ((sloc == ONEDGE) || (sloc == ONFACE)) {
      // Found a subface/edge containing proj(c).
      // Check if 'c' encoraches upon this subface.
      REAL fcent[3], r = 0;
      ppt = (point *) &(searchsh.sh[3]);
      if (checkfac4encroach(ppt[0], ppt[1], ppt[2], ccent, fcent, &r)) {
        // Encroached. Split this subface.
        splitflag = splitsubface(&searchsh, NULL, org(*splittet), qflag, 
                                 fcent, chkencflag | 2);
        if (splitflag) {
          // Some subfaces may need to be repaired.
          repairencfacs(chkencflag | 2);
        }
      } 
    }
    else if ((sloc == OUTSIDE) || (sloc == ENCSEGMENT)) {
      // Hit a segment. We should split it. 
      // To be done...
    } 
    if (splitflag) {
      // Queue the tet if it is still alive.
      if ((splittet->tet != NULL) && (splittet->tet[4] != NULL)) {
        enqueuetetrahedron(splittet);
      }
    }
    return splitflag;
  }



  // Use Bowyer-Watson algorithm. Preserve subsegments and subfaces;
  ivf.bowywat = 3;
  ivf.lawson = 2;
  ivf.rejflag = 3;  // Do check for encroached segments and subfaces.
  if (b->metric) {
    ivf.rejflag |= 4; // Reject it if it lies in some protecting balls.
  }
  ivf.chkencflag = chkencflag;
  ivf.sloc = ivf.sbowywat = 0; // No use.
  ivf.splitbdflag = 0; // No use.
  ivf.validflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;

  ivf.refineflag = 1;
  ivf.refinetet = *splittet;


  if (insertpoint(newpt, &searchtet, NULL, NULL, &ivf)) {
    // Vertex is inserted.
    st_volref_count++;
    if (steinerleft > 0) steinerleft--;
    if (flipstack != NULL) {
      flipconstraints fc;
      fc.chkencflag = chkencflag;
      fc.enqflag = 2;
      lawsonflip3d(&fc);
      unflipqueue->restart();
    }
    return 1;
  } else {
    // Point is not inserted.
    pointdealloc(newpt);
    // Check if there are encroached segments/subfaces.
    if (ivf.iloc == (int) ENCSEGMENT) {
      if (!b->nobisect || checkconstraints) {  
        // Select an encroached segment and split it.
        for (i = 0; i < encseglist->objects; i++) {
          paryseg = (face *) fastlookup(encseglist, i);
          if (splitsegment(paryseg, NULL, rv, org(*splittet), NULL, qflag, 
                           chkencflag | 3)) {
            splitflag = 1; // A point is inserted on a segment.
            break;
          }
        }
      } // if (!b->nobisect)
      encseglist->restart();
      if (splitflag) {
        // Some segments may need to be repaired.
        if (badsubsegs->items > 0) {
          repairencsegs(chkencflag | 3);
        }
        // Some subfaces may need to be repaired.
        if (badsubfacs->items > 0) {
          repairencfacs(chkencflag | 2);
        }
      }
    } else if (ivf.iloc == (int) ENCSUBFACE) {
      if (!b->nobisect || checkconstraints) {
        // Select an encroached subface and split it.
        for (i = 0; i < encshlist->objects; i++) {
          bface = (badface *) fastlookup(encshlist, i);
          if (splitsubface(&(bface->ss), NULL, org(*splittet), qflag, 
                           bface->cent, chkencflag | 2)){
            splitflag = 1; // A point is inserted on a subface or a segment.
            break;
          }
        }
      } // if (!b->nobisect)
      encshlist->restart();
      if (splitflag) {
        // Some subfaces may need to be repaired.
        if (badsubfacs->items > 0) {
          repairencfacs(chkencflag | 2);
        }
      }
    } else {
      if (ivf.iloc == (int) NEARVERTEX) {
        terminatetetgen(this, 2);
      }
    }
    if (splitflag) {
      // Queue the tet if it is still alive.
      if ((splittet->tet != NULL) && (splittet->tet[4] != NULL)) {
        enqueuetetrahedron(splittet);
      }
    }
    return splitflag;
  }
}